

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O1

bool __thiscall
Assimp::DefaultLogger::detatchStream(DefaultLogger *this,LogStream *pStream,uint severity)

{
  pointer *pppLVar1;
  pointer ppLVar2;
  LogStreamInfo *pLVar3;
  LogStream *pLVar4;
  pointer ppLVar5;
  uint uVar6;
  pointer __dest;
  bool bVar7;
  
  if (pStream == (LogStream *)0x0) {
    bVar7 = false;
  }
  else {
    __dest = (this->m_StreamArray).
             super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppLVar2 = (this->m_StreamArray).
              super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    bVar7 = __dest != ppLVar2;
    if (bVar7) {
      pLVar3 = *__dest;
      pLVar4 = pLVar3->m_pStream;
      while (pLVar4 != pStream) {
        __dest = __dest + 1;
        bVar7 = __dest != ppLVar2;
        if (__dest == ppLVar2) {
          return bVar7;
        }
        pLVar3 = *__dest;
        pLVar4 = pLVar3->m_pStream;
      }
      uVar6 = 0xfffffff0;
      if (severity != 0) {
        uVar6 = ~severity;
      }
      pLVar3->m_uiErrorSeverity = pLVar3->m_uiErrorSeverity & uVar6;
      if ((*__dest)->m_uiErrorSeverity == 0) {
        (*__dest)->m_pStream = (LogStream *)0x0;
        pLVar3 = *__dest;
        if (pLVar3 != (LogStreamInfo *)0x0) {
          if (pLVar3->m_pStream != (LogStream *)0x0) {
            (*pLVar3->m_pStream->_vptr_LogStream[1])();
          }
          operator_delete(pLVar3);
        }
        ppLVar2 = __dest + 1;
        ppLVar5 = (this->m_StreamArray).
                  super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppLVar2 != ppLVar5) {
          memmove(__dest,ppLVar2,(long)ppLVar5 - (long)ppLVar2);
        }
        pppLVar1 = &(this->m_StreamArray).
                    super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppLVar1 = *pppLVar1 + -1;
      }
    }
  }
  return bVar7;
}

Assistant:

bool DefaultLogger::detatchStream( LogStream *pStream, unsigned int severity ) {
    if ( nullptr == pStream ) {
        return false;
    }

    if (0 == severity)  {
        severity = SeverityAll;
    }

    bool res( false );
    for ( StreamIt it = m_StreamArray.begin(); it != m_StreamArray.end(); ++it ) {
        if ( (*it)->m_pStream == pStream ) {
            (*it)->m_uiErrorSeverity &= ~severity;
            if ( (*it)->m_uiErrorSeverity == 0 ) {
                // don't delete the underlying stream 'cause the caller gains ownership again
                (**it).m_pStream = nullptr;
                delete *it;
                m_StreamArray.erase( it );
                res = true;
                break;
            }
            return true;
        }
    }
    return res;
}